

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

bool operator<(CNetAddr *a,CNetAddr *b)

{
  weak_ordering wVar1;
  long in_FS_OFFSET;
  CNetAddr *local_28;
  Network *local_20;
  CNetAddr *local_18;
  Network *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &a->m_net;
  local_20 = &b->m_net;
  local_28 = b;
  local_18 = a;
  wVar1 = std::
          __tuple_cmp<std::weak_ordering,std::tuple<Network_const&,prevector<16u,unsigned_char,unsigned_int,int>const&>,std::tuple<Network_const&,prevector<16u,unsigned_char,unsigned_int,int>const&>,0ul,1ul>
                    (&local_18,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)((byte)wVar1._M_value >> 7);
  }
  __stack_chk_fail();
}

Assistant:

bool operator<(const CNetAddr& a, const CNetAddr& b)
{
    return std::tie(a.m_net, a.m_addr) < std::tie(b.m_net, b.m_addr);
}